

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ElemStack::expandMap(ElemStack *this,StackElem *toExpand)

{
  XMLSize_t XVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar3;
  undefined1 auVar4 [16];
  ulong local_40;
  PrefMapElem *newMap;
  XMLSize_t newCapacity;
  XMLSize_t oldCap;
  StackElem *toExpand_local;
  ElemStack *this_local;
  
  XVar1 = toExpand->fMapCapacity;
  if (XVar1 == 0) {
    local_40 = 0x10;
  }
  else {
    auVar4._8_4_ = (int)(XVar1 >> 0x20);
    auVar4._0_8_ = XVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)XVar1) - 4503599627370496.0)) * 1.25;
    local_40 = (ulong)dVar3;
    local_40 = local_40 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_40 >> 0x3f;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,local_40 << 3);
  memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar2),toExpand->fMap,XVar1 << 3);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,toExpand->fMap);
  toExpand->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar2);
  toExpand->fMapCapacity = local_40;
  return;
}

Assistant:

void ElemStack::expandMap(StackElem* const toExpand)
{
    // For convenience get the old map size
    const XMLSize_t oldCap = toExpand->fMapCapacity;

    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const XMLSize_t  newCapacity = oldCap ?
                                     (XMLSize_t )(oldCap * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    memcpy(newMap, toExpand->fMap, oldCap * sizeof(PrefMapElem));

    // Delete the old map and store the new stuff
    fMemoryManager->deallocate(toExpand->fMap);//delete [] toExpand->fMap;
    toExpand->fMap = newMap;
    toExpand->fMapCapacity = newCapacity;
}